

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O1

const_iterator __thiscall qpdf::Array::cbegin(Array *this)

{
  pointer __p;
  QPDF_Array *pQVar1;
  pointer __p_00;
  const_iterator cVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar3;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_38;
  __uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  local_20;
  
  pQVar1 = BaseHandle::as<QPDF_Array>(&this->super_BaseHandle);
  if (pQVar1 == (QPDF_Array *)0x0) {
    cVar2._M_current = (QPDFObjectHandle *)0x0;
  }
  else {
    if ((pQVar1->sp)._M_t.
        super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
        super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
        super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl == (Sparse *)0x0) {
      pvVar3 = &pQVar1->elements;
    }
    else {
      if ((this->sp_elements)._M_t.
          super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
          .
          super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
          ._M_head_impl == (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)0x0) {
        getAsVector(&local_38,this);
        __p_00 = (pointer)operator_new(0x18);
        (__p_00->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
        super__Vector_impl_data._M_start =
             local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (__p_00->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (__p_00->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_20._M_t.
        super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        .
        super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
        ._M_head_impl =
             (tuple<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
              )(_Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                )0x0;
        std::
        __uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        ::reset((__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                 *)&this->sp_elements,__p_00);
        std::
        unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                       *)&local_20);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_38);
      }
      pvVar3 = (this->sp_elements)._M_t.
               super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
               .
               super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
               ._M_head_impl;
    }
    cVar2._M_current =
         (pvVar3->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
         super__Vector_impl_data._M_start;
  }
  return (const_iterator)cVar2._M_current;
}

Assistant:

Array::const_iterator
Array::cbegin()
{
    if (auto a = as<QPDF_Array>()) {
        if (!a->sp) {
            return a->elements.cbegin();
        }
        if (!sp_elements) {
            sp_elements = std::make_unique<std::vector<QPDFObjectHandle>>(getAsVector());
        }
        return sp_elements->cbegin();
    }
    return {};
}